

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool anon_unknown.dwarf_37d8e::UpdateOptionsFromCommandLine(Options *options,int argc,char **argv)

{
  bool bVar1;
  invalid_argument *this;
  undefined8 uVar2;
  ulong uVar3;
  bool local_609;
  bool local_5c9;
  bool local_589;
  bool local_549;
  bool local_509;
  bool local_4c9;
  bool local_489;
  invalid_argument *ia;
  string local_438 [39];
  undefined1 local_411;
  string local_410 [32];
  int local_3f0;
  byte local_3e9;
  locale local_3e8 [13];
  byte local_3db;
  byte local_3da;
  allocator local_3d9;
  string local_3d8 [32];
  locale local_3b8 [15];
  allocator local_3a9;
  string local_3a8 [39];
  byte local_381;
  locale local_380 [13];
  byte local_373;
  byte local_372;
  allocator local_371;
  string local_370 [32];
  locale local_350 [15];
  allocator local_341;
  string local_340 [32];
  __0 local_320 [39];
  byte local_2f9;
  locale local_2f8 [13];
  byte local_2eb;
  byte local_2ea;
  allocator local_2e9;
  string local_2e8 [32];
  locale local_2c8 [15];
  allocator local_2b9;
  string local_2b8 [32];
  __0 local_298 [39];
  byte local_271;
  locale local_270 [13];
  byte local_263;
  byte local_262;
  allocator local_261;
  string local_260 [32];
  locale local_240 [15];
  allocator local_231;
  string local_230 [32];
  __0 local_210 [39];
  byte local_1e9;
  locale local_1e8 [13];
  byte local_1db;
  byte local_1da;
  allocator local_1d9;
  string local_1d8 [32];
  locale local_1b8 [15];
  allocator local_1a9;
  string local_1a8 [32];
  __0 local_188 [39];
  byte local_161;
  locale local_160 [13];
  byte local_153;
  byte local_152;
  allocator local_151;
  string local_150 [32];
  locale local_130 [15];
  allocator local_121;
  string local_120 [32];
  __0 local_100 [39];
  byte local_d9;
  locale local_d8 [13];
  byte local_cb;
  byte local_ca;
  allocator local_c9;
  string local_c8 [32];
  locale local_a8 [31];
  allocator local_89;
  string local_88 [32];
  __0 local_68 [8];
  string arg;
  anon_class_24_3_c76584a5 getNextArg;
  int i;
  char **argv_local;
  int argc_local;
  Options *options_local;
  
  do {
    if (argc < 2) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        Options::ParseStrings(options);
        options_local._7_1_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_438,"GraphicsPlugin parameter is required",(allocator *)((long)&ia + 7));
        Log::Write(Error,(string *)local_438);
        std::__cxx11::string::~string(local_438);
        std::allocator<char>::~allocator((allocator<char> *)((long)&ia + 7));
        ShowHelp();
        options_local._7_1_ = 0;
      }
      break;
    }
    (anonymous_namespace)::UpdateOptionsFromCommandLine(Options&,int,char**)::$_0::
    operator()[abi_cxx11_(local_68);
    std::allocator<char>::allocator();
    local_ca = 0;
    local_cb = 0;
    local_d9 = 0;
    std::__cxx11::string::string(local_88,"--graphics",&local_89);
    std::locale::locale(local_a8);
    bVar1 = EqualsIgnoreCase((string *)local_68,(string *)local_88,local_a8);
    local_489 = true;
    if (!bVar1) {
      std::allocator<char>::allocator();
      local_ca = 1;
      std::__cxx11::string::string(local_c8,"-g",&local_c9);
      local_cb = 1;
      std::locale::locale(local_d8);
      local_d9 = 1;
      local_489 = EqualsIgnoreCase((string *)local_68,(string *)local_c8,local_d8);
    }
    if ((local_d9 & 1) != 0) {
      std::locale::~locale(local_d8);
    }
    if ((local_cb & 1) != 0) {
      std::__cxx11::string::~string(local_c8);
    }
    if ((local_ca & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    }
    std::locale::~locale(local_a8);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    if (local_489 == false) {
      std::allocator<char>::allocator();
      local_152 = 0;
      local_153 = 0;
      local_161 = 0;
      std::__cxx11::string::string(local_120,"--formfactor",&local_121);
      std::locale::locale(local_130);
      bVar1 = EqualsIgnoreCase((string *)local_68,(string *)local_120,local_130);
      local_4c9 = true;
      if (!bVar1) {
        std::allocator<char>::allocator();
        local_152 = 1;
        std::__cxx11::string::string(local_150,"-ff",&local_151);
        local_153 = 1;
        std::locale::locale(local_160);
        local_161 = 1;
        local_4c9 = EqualsIgnoreCase((string *)local_68,(string *)local_150,local_160);
      }
      if ((local_161 & 1) != 0) {
        std::locale::~locale(local_160);
      }
      if ((local_153 & 1) != 0) {
        std::__cxx11::string::~string(local_150);
      }
      if ((local_152 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_151);
      }
      std::locale::~locale(local_130);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
      if (local_4c9 != false) {
        (anonymous_namespace)::UpdateOptionsFromCommandLine(Options&,int,char**)::$_0::
        operator()[abi_cxx11_(local_188);
        std::__cxx11::string::operator=((string *)&options->FormFactor,(string *)local_188);
        std::__cxx11::string::~string((string *)local_188);
        goto LAB_00116314;
      }
      std::allocator<char>::allocator();
      local_1da = 0;
      local_1db = 0;
      local_1e9 = 0;
      std::__cxx11::string::string(local_1a8,"--viewconfig",&local_1a9);
      std::locale::locale(local_1b8);
      bVar1 = EqualsIgnoreCase((string *)local_68,(string *)local_1a8,local_1b8);
      local_509 = true;
      if (!bVar1) {
        std::allocator<char>::allocator();
        local_1da = 1;
        std::__cxx11::string::string(local_1d8,"-vc",&local_1d9);
        local_1db = 1;
        std::locale::locale(local_1e8);
        local_1e9 = 1;
        local_509 = EqualsIgnoreCase((string *)local_68,(string *)local_1d8,local_1e8);
      }
      if ((local_1e9 & 1) != 0) {
        std::locale::~locale(local_1e8);
      }
      if ((local_1db & 1) != 0) {
        std::__cxx11::string::~string(local_1d8);
      }
      if ((local_1da & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      }
      std::locale::~locale(local_1b8);
      std::__cxx11::string::~string(local_1a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
      if (local_509 != false) {
        (anonymous_namespace)::UpdateOptionsFromCommandLine(Options&,int,char**)::$_0::
        operator()[abi_cxx11_(local_210);
        std::__cxx11::string::operator=((string *)&options->ViewConfiguration,(string *)local_210);
        std::__cxx11::string::~string((string *)local_210);
        goto LAB_00116314;
      }
      std::allocator<char>::allocator();
      local_262 = 0;
      local_263 = 0;
      local_271 = 0;
      std::__cxx11::string::string(local_230,"--blendmode",&local_231);
      std::locale::locale(local_240);
      bVar1 = EqualsIgnoreCase((string *)local_68,(string *)local_230,local_240);
      local_549 = true;
      if (!bVar1) {
        std::allocator<char>::allocator();
        local_262 = 1;
        std::__cxx11::string::string(local_260,"-bm",&local_261);
        local_263 = 1;
        std::locale::locale(local_270);
        local_271 = 1;
        local_549 = EqualsIgnoreCase((string *)local_68,(string *)local_260,local_270);
      }
      if ((local_271 & 1) != 0) {
        std::locale::~locale(local_270);
      }
      if ((local_263 & 1) != 0) {
        std::__cxx11::string::~string(local_260);
      }
      if ((local_262 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_261);
      }
      std::locale::~locale(local_240);
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
      if (local_549 != false) {
        (anonymous_namespace)::UpdateOptionsFromCommandLine(Options&,int,char**)::$_0::
        operator()[abi_cxx11_(local_298);
        std::__cxx11::string::operator=
                  ((string *)&options->EnvironmentBlendMode,(string *)local_298);
        std::__cxx11::string::~string((string *)local_298);
        goto LAB_00116314;
      }
      std::allocator<char>::allocator();
      local_2ea = 0;
      local_2eb = 0;
      local_2f9 = 0;
      std::__cxx11::string::string(local_2b8,"--space",&local_2b9);
      std::locale::locale(local_2c8);
      bVar1 = EqualsIgnoreCase((string *)local_68,(string *)local_2b8,local_2c8);
      local_589 = true;
      if (!bVar1) {
        std::allocator<char>::allocator();
        local_2ea = 1;
        std::__cxx11::string::string(local_2e8,"-s",&local_2e9);
        local_2eb = 1;
        std::locale::locale(local_2f8);
        local_2f9 = 1;
        local_589 = EqualsIgnoreCase((string *)local_68,(string *)local_2e8,local_2f8);
      }
      if ((local_2f9 & 1) != 0) {
        std::locale::~locale(local_2f8);
      }
      if ((local_2eb & 1) != 0) {
        std::__cxx11::string::~string(local_2e8);
      }
      if ((local_2ea & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      }
      std::locale::~locale(local_2c8);
      std::__cxx11::string::~string(local_2b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
      if (local_589 != false) {
        (anonymous_namespace)::UpdateOptionsFromCommandLine(Options&,int,char**)::$_0::
        operator()[abi_cxx11_(local_320);
        std::__cxx11::string::operator=((string *)&options->AppSpace,(string *)local_320);
        std::__cxx11::string::~string((string *)local_320);
        goto LAB_00116314;
      }
      std::allocator<char>::allocator();
      local_372 = 0;
      local_373 = 0;
      local_381 = 0;
      std::__cxx11::string::string(local_340,"--verbose",&local_341);
      std::locale::locale(local_350);
      bVar1 = EqualsIgnoreCase((string *)local_68,(string *)local_340,local_350);
      local_5c9 = true;
      if (!bVar1) {
        std::allocator<char>::allocator();
        local_372 = 1;
        std::__cxx11::string::string(local_370,"-v",&local_371);
        local_373 = 1;
        std::locale::locale(local_380);
        local_381 = 1;
        local_5c9 = EqualsIgnoreCase((string *)local_68,(string *)local_370,local_380);
      }
      if ((local_381 & 1) != 0) {
        std::locale::~locale(local_380);
      }
      if ((local_373 & 1) != 0) {
        std::__cxx11::string::~string(local_370);
      }
      if ((local_372 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_371);
      }
      std::locale::~locale(local_350);
      std::__cxx11::string::~string(local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
      if (local_5c9 != false) {
        Log::SetLevel(Verbose);
        goto LAB_00116314;
      }
      std::allocator<char>::allocator();
      local_3da = 0;
      local_3db = 0;
      local_3e9 = 0;
      std::__cxx11::string::string(local_3a8,"--help",&local_3a9);
      std::locale::locale(local_3b8);
      bVar1 = EqualsIgnoreCase((string *)local_68,(string *)local_3a8,local_3b8);
      local_609 = true;
      if (!bVar1) {
        std::allocator<char>::allocator();
        local_3da = 1;
        std::__cxx11::string::string(local_3d8,"-h",&local_3d9);
        local_3db = 1;
        std::locale::locale(local_3e8);
        local_3e9 = 1;
        local_609 = EqualsIgnoreCase((string *)local_68,(string *)local_3d8,local_3e8);
      }
      if ((local_3e9 & 1) != 0) {
        std::locale::~locale(local_3e8);
      }
      if ((local_3db & 1) != 0) {
        std::__cxx11::string::~string(local_3d8);
      }
      if ((local_3da & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
      }
      std::locale::~locale(local_3b8);
      std::__cxx11::string::~string(local_3a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
      if (local_609 == false) {
        local_411 = 1;
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        uVar2 = std::__cxx11::string::c_str();
        Fmt_abi_cxx11_((char *)local_410,"Unknown argument: %s",uVar2);
        std::invalid_argument::invalid_argument(this,local_410);
        local_411 = 0;
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      ShowHelp();
      options_local._7_1_ = 0;
      local_3f0 = 1;
    }
    else {
      (anonymous_namespace)::UpdateOptionsFromCommandLine(Options&,int,char**)::$_0::
      operator()[abi_cxx11_(local_100);
      std::__cxx11::string::operator=((string *)options,(string *)local_100);
      std::__cxx11::string::~string((string *)local_100);
LAB_00116314:
      local_3f0 = 0;
    }
    std::__cxx11::string::~string((string *)local_68);
  } while (local_3f0 == 0);
  return (bool)(options_local._7_1_ & 1);
}

Assistant:

bool UpdateOptionsFromCommandLine(Options& options, int argc, char* argv[]) {
    int i = 1;  // Index 0 is the program name and is skipped.

    auto getNextArg = [&] {
        if (i >= argc) {
            throw std::invalid_argument("Argument parameter missing");
        }

        return std::string(argv[i++]);
    };

    while (i < argc) {
        const std::string arg = getNextArg();
        if (EqualsIgnoreCase(arg, "--graphics") || EqualsIgnoreCase(arg, "-g")) {
            options.GraphicsPlugin = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--formfactor") || EqualsIgnoreCase(arg, "-ff")) {
            options.FormFactor = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--viewconfig") || EqualsIgnoreCase(arg, "-vc")) {
            options.ViewConfiguration = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--blendmode") || EqualsIgnoreCase(arg, "-bm")) {
            options.EnvironmentBlendMode = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--space") || EqualsIgnoreCase(arg, "-s")) {
            options.AppSpace = getNextArg();
        } else if (EqualsIgnoreCase(arg, "--verbose") || EqualsIgnoreCase(arg, "-v")) {
            Log::SetLevel(Log::Level::Verbose);
        } else if (EqualsIgnoreCase(arg, "--help") || EqualsIgnoreCase(arg, "-h")) {
            ShowHelp();
            return false;
        } else {
            throw std::invalid_argument(Fmt("Unknown argument: %s", arg.c_str()));
        }
    }

    // Check for required parameters.
    if (options.GraphicsPlugin.empty()) {
        Log::Write(Log::Level::Error, "GraphicsPlugin parameter is required");
        ShowHelp();
        return false;
    }

    try {
        options.ParseStrings();
    } catch (std::invalid_argument& ia) {
        Log::Write(Log::Level::Error, ia.what());
        ShowHelp();
        return false;
    }
    return true;
}